

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall iDynTree::KinDynComputations::loadRobotModel(KinDynComputations *this,Model *model)

{
  Model *in_RSI;
  KinDynComputations *in_RDI;
  KinDynComputations *unaff_retaddr;
  
  iDynTree::Model::operator=(&in_RDI->pimpl->m_robot_model,in_RSI);
  in_RDI->pimpl->m_isModelValid = true;
  iDynTree::Model::computeFullTreeTraversal((Traversal *)&in_RDI->pimpl->m_robot_model);
  resizeInternalDataStructures(unaff_retaddr);
  invalidateCache(in_RDI);
  return true;
}

Assistant:

bool KinDynComputations::loadRobotModel(const Model& model)
{
    this->pimpl->m_robot_model = model;
    this->pimpl->m_isModelValid = true;
    this->pimpl->m_robot_model.computeFullTreeTraversal(this->pimpl->m_traversal);
    this->resizeInternalDataStructures();
    this->invalidateCache();
    return true;
}